

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::flip_horizontally(TGAImage *this)

{
  int iVar1;
  TGAColor TVar2;
  TGAColor local_2e;
  undefined1 auStack_29 [3];
  TGAColor c2;
  TGAColor c1;
  int j;
  int i;
  int half;
  TGAImage *this_local;
  
  if (this->data == (uchar *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = this->width;
    c1.bgra[1] = '\0';
    c1.bgra[2] = '\0';
    c1.bgra[3] = '\0';
    c1.bytespp = '\0';
    for (; (int)c1._1_4_ < iVar1 >> 1; c1._1_4_ = c1._1_4_ + 1) {
      for (stack0xffffffffffffffdc = 0; stack0xffffffffffffffdc < this->height;
          register0x00000000 = stack0xffffffffffffffdc + 1) {
        TVar2 = get(this,c1._1_4_,stack0xffffffffffffffdc);
        _auStack_29 = TVar2.bgra;
        c2.bgra[1] = TVar2.bytespp;
        TVar2 = get(this,~c1._1_4_ + this->width,stack0xffffffffffffffdc);
        local_2e.bgra = TVar2.bgra;
        local_2e.bytespp = TVar2.bytespp;
        set(this,c1._1_4_,stack0xffffffffffffffdc,&local_2e);
        set(this,(this->width + -1) - c1._1_4_,stack0xffffffffffffffdc,(TGAColor *)auStack_29);
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TGAImage::flip_horizontally() {
    if (!data) return false;
    int half = width>>1;
    for (int i=0; i<half; i++) {
        for (int j=0; j<height; j++) {
            TGAColor c1 = get(i, j);
            TGAColor c2 = get(width-1-i, j);
            set(i, j, c2);
            set(width-1-i, j, c1);
        }
    }
    return true;
}